

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::SectionStats::SectionStats
          (SectionStats *this,SectionInfo *_sectionInfo,Counts *_assertions,
          double _durationInSeconds,bool _missingAssertions)

{
  byte in_CL;
  SectionInfo *in_RDX;
  SectionInfo *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  
  *in_RDI = &PTR__SectionStats_002f0f40;
  SectionInfo::SectionInfo(in_RSI,in_RDX);
  in_RDI[0xb] = *(undefined8 *)&in_RDX->name;
  in_RDI[0xc] = (in_RDX->name)._M_string_length;
  in_RDI[0xd] = (in_RDX->name).field_2._M_allocated_capacity;
  in_RDI[0xe] = in_XMM0_Qa;
  *(byte *)(in_RDI + 0xf) = in_CL & 1;
  return;
}

Assistant:

SectionStats::SectionStats(  SectionInfo const& _sectionInfo,
                                 Counts const& _assertions,
                                 double _durationInSeconds,
                                 bool _missingAssertions )
    :   sectionInfo( _sectionInfo ),
        assertions( _assertions ),
        durationInSeconds( _durationInSeconds ),
        missingAssertions( _missingAssertions )
    {}